

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

void __thiscall
google::protobuf::io::FileInputStream::FileInputStream
          (FileInputStream *this,int file_descriptor,int block_size)

{
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__FileInputStream_00649220;
  (this->copying_input_).super_CopyingInputStream._vptr_CopyingInputStream =
       (_func_int **)&PTR__CopyingFileInputStream_00649260;
  (this->copying_input_).file_ = file_descriptor;
  (this->copying_input_).close_on_delete_ = false;
  (this->copying_input_).is_closed_ = false;
  (this->copying_input_).errno_ = 0;
  (this->copying_input_).previous_seek_failed_ = false;
  CopyingInputStreamAdaptor::CopyingInputStreamAdaptor
            (&this->impl_,&(this->copying_input_).super_CopyingInputStream,block_size);
  return;
}

Assistant:

FileInputStream::FileInputStream(int file_descriptor, int block_size)
    : copying_input_(file_descriptor), impl_(&copying_input_, block_size) {}